

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::CopyFileContentBlockwise(string *source,string *destination)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  long lVar5;
  undefined1 local_1448 [8];
  char buffer [4096];
  long lStack_438;
  int bufferSize;
  ofstream fout;
  long local_228;
  ifstream fin;
  string *destination_local;
  string *source_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_228,pcVar4,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    SystemTools::RemoveFile(destination);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_out,_S_trunc);
    _Var3 = std::operator|(_Var3,_S_bin);
    std::ofstream::ofstream(&stack0xfffffffffffffbc8,pcVar4,_Var3);
    bVar1 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffbc8 +
                                       *(long *)(lStack_438 + -0x18)));
    if ((bVar1 & 1) == 0) {
      while (bVar2 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&local_228 + *(long *)(local_228 + -0x18))), bVar2) {
        std::istream::read((char *)&local_228,(long)local_1448);
        lVar5 = std::istream::gcount();
        if (lVar5 == 0) break;
        std::istream::gcount();
        std::ostream::write((char *)&stack0xfffffffffffffbc8,(long)local_1448);
      }
      std::ostream::flush();
      std::ifstream::close();
      std::ofstream::close();
      bVar1 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffbc8 +
                                         *(long *)(lStack_438 + -0x18)));
      if ((bVar1 & 1) == 0) {
        source_local._7_1_ = true;
      }
      else {
        source_local._7_1_ = false;
      }
    }
    else {
      source_local._7_1_ = false;
    }
    fout._504_4_ = 1;
    std::ofstream::~ofstream(&stack0xfffffffffffffbc8);
  }
  else {
    source_local._7_1_ = false;
    fout._504_4_ = 1;
  }
  std::ifstream::~ifstream(&local_228);
  return source_local._7_1_;
}

Assistant:

static bool CopyFileContentBlockwise(const std::string& source,
                                     const std::string& destination)
{
// Open files
#if defined(_WIN32)
  kwsys::ifstream fin(
    Encoding::ToNarrow(Encoding::ToWindowsExtendedPath(source)).c_str(),
    std::ios::in | std::ios::binary);
#else
  kwsys::ifstream fin(source.c_str(), std::ios::in | std::ios::binary);
#endif
  if (!fin) {
    return false;
  }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(destination);

#if defined(_WIN32)
  kwsys::ofstream fout(
    Encoding::ToNarrow(Encoding::ToWindowsExtendedPath(destination)).c_str(),
    std::ios::out | std::ios::trunc | std::ios::binary);
#else
  kwsys::ofstream fout(destination.c_str(),
                       std::ios::out | std::ios::trunc | std::ios::binary);
#endif
  if (!fout) {
    return false;
  }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while (fin) {
    const int bufferSize = 4096;
    char buffer[bufferSize];

    fin.read(buffer, bufferSize);
    if (fin.gcount()) {
      fout.write(buffer, fin.gcount());
    } else {
      break;
    }
  }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if (!fout) {
    return false;
  }

  return true;
}